

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O1

LocalSet * __thiscall wasm::Pusher::isPushable(Pusher *this,Expression *curr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  EffectAnalyzer local_178;
  
  if (curr->_id != LocalSetId) {
    return (LocalSet *)0x0;
  }
  uVar4 = (ulong)*(uint *)(curr + 1);
  if ((((this->analyzer->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[*(uint *)(curr + 1) >> 6] >>
        (uVar4 & 0x3f) & 1) == 0) ||
     ((this->numGetsSoFar->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4] !=
      (this->analyzer->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar4])) {
    bVar2 = false;
  }
  else {
    EffectAnalyzer::EffectAnalyzer
              (&local_178,this->passOptions,this->module,(Expression *)curr[1].type.id);
    bVar3 = EffectAnalyzer::hasNonTrapSideEffects(&local_178);
    bVar1 = true;
    bVar2 = true;
    if (!bVar3) {
      if ((local_178.trap == true) && (local_178.trapsNeverHappen == false)) {
        curr = (Expression *)(LocalSet *)0x0;
      }
      goto LAB_007fad02;
    }
  }
  bVar1 = bVar2;
  curr = (Expression *)(LocalSet *)0x0;
LAB_007fad02:
  if (bVar1) {
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_178.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_178.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_178.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_178.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_178.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_178.localsRead._M_t);
  }
  return (LocalSet *)curr;
}

Assistant:

LocalSet* isPushable(Expression* curr) {
    auto* set = curr->dynCast<LocalSet>();
    if (!set) {
      return nullptr;
    }
    auto index = set->index;
    // To be pushable, this must be SFA and the right # of gets.
    //
    // It must also not have side effects, as it may no longer execute after it
    // is pushed, since it may be behind a condition that ends up false some of
    // the time. However, removable side effects are ok here. The general
    // problem with removable effects is that we can only remove them, but not
    // move them, because of stuff like this:
    //
    //   if (x != 0) foo(1 / x);
    //
    // If we move 1 / x to execute unconditionally then it may trap, but it
    // would be fine to remove it. This pass does not move code to places where
    // it might execute more, but *less*: we keep the code behind any conditions
    // it was already behind, and potentially put it behind further ones. In
    // effect, we "partially remove" the code, making it not execute some of the
    // time, which is fine.
    if (analyzer.isSFA(index) &&
        numGetsSoFar[index] == analyzer.getNumGets(index) &&
        !EffectAnalyzer(passOptions, module, set->value)
           .hasUnremovableSideEffects()) {
      return set;
    }
    return nullptr;
  }